

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Aig_Man_t * Saig_ManWindowExtractMiter(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t **ppAVar1;
  void **ppvVar2;
  int *piVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  Vec_Ptr_t *vNodes0;
  Vec_Ptr_t *vNodes0_00;
  ulong uVar7;
  Aig_Man_t *pNew;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Aig_Obj_t *pAVar13;
  uint uVar14;
  Aig_Obj_t *pAVar15;
  Aig_Obj_t *pAVar16;
  ulong uVar17;
  int iVar18;
  
  iVar18 = p0->nTruePos;
  lVar6 = (long)iVar18;
  if (0 < lVar6) {
    lVar12 = 0;
    do {
      if ((p0->vCos->nSize <= lVar12) || (p1->vCos->nSize <= lVar12)) goto LAB_006f4596;
      if (p0->pReprs == (Aig_Obj_t **)0x0) goto LAB_006f45b5;
      pAVar9 = (Aig_Obj_t *)p0->vCos->pArray[lVar12];
      pAVar13 = (Aig_Obj_t *)p1->vCos->pArray[lVar12];
      p0->pReprs[pAVar9->Id] = pAVar13;
      if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006f45b5;
      p1->pReprs[pAVar13->Id] = pAVar9;
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  lVar12 = (long)p0->nRegs;
  if (0 < lVar12) {
    do {
      if ((iVar18 < 0) || (p0->vCos->nSize <= lVar6)) goto LAB_006f4596;
      pAVar9 = (Aig_Obj_t *)p0->vCos->pArray[lVar6];
      if (((*(uint *)&pAVar9->field_0x18 & 7) != 3) || ((pAVar9->field_0).CioId < iVar18)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar14 = ((pAVar9->field_0).CioId - iVar18) + p0->nTruePis;
      if (((int)uVar14 < 0) || (p0->vCis->nSize <= (int)uVar14)) goto LAB_006f4596;
      pAVar13 = (Aig_Obj_t *)p0->vCis->pArray[uVar14];
      ppAVar1 = p0->pReprs;
      if (ppAVar1 == (Aig_Obj_t **)0x0) {
        pAVar15 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar15 = ppAVar1[pAVar13->Id];
      }
      if (pAVar15 != (Aig_Obj_t *)0x0) {
        if (p1->pReprs == (Aig_Obj_t **)0x0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = p1->pReprs[pAVar15->Id];
        }
        if (pAVar13 != pAVar16) {
          __assert_fail("pMatch0 == Aig_ObjRepr( p1, pMatch1 )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x2df,"Aig_Man_t *Saig_ManWindowExtractMiter(Aig_Man_t *, Aig_Man_t *)");
        }
        if (((*(uint *)&pAVar15->field_0x18 & 7) != 2) || ((pAVar15->field_0).CioId < p1->nTruePis))
        goto LAB_006f45d4;
        uVar14 = ((pAVar15->field_0).CioId - p1->nTruePis) + p1->nTruePos;
        if (((int)uVar14 < 0) || (p1->vCos->nSize <= (int)uVar14)) goto LAB_006f4596;
        if (ppAVar1 == (Aig_Obj_t **)0x0) {
LAB_006f45b5:
          __assert_fail("p->pReprs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        pAVar13 = (Aig_Obj_t *)p1->vCos->pArray[uVar14];
        ppAVar1[pAVar9->Id] = pAVar13;
        if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006f45b5;
        p1->pReprs[pAVar13->Id] = pAVar9;
      }
      lVar6 = lVar6 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  vNodes0 = Saig_ManCollectedDiffNodes(p0,p1);
  vNodes0_00 = Saig_ManCollectedDiffNodes(p1,p0);
  iVar18 = vNodes0->nSize;
  lVar6 = (long)iVar18;
  uVar14 = vNodes0_00->nSize;
  uVar7 = (ulong)uVar14;
  pNew = Aig_ManStart(uVar14 + iVar18);
  pcVar8 = (char *)malloc(4);
  builtin_strncpy(pcVar8,"wnd",4);
  pNew->pName = pcVar8;
  pNew->pSpec = (char *)0x0;
  p0->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  Saig_ManWindowCreatePis(pNew,p0,p1,vNodes0);
  Saig_ManWindowCreatePis(pNew,p1,p0,vNodes0_00);
  if (0 < lVar6) {
    ppvVar2 = vNodes0->pArray;
    lVar12 = 0;
    do {
      piVar3 = (int *)ppvVar2[lVar12];
      if (((piVar3[6] & 7U) == 2) && (p0->nTruePis <= *piVar3)) {
        pAVar9 = Aig_ObjCreateCi(pNew);
        *(Aig_Obj_t **)(piVar3 + 10) = pAVar9;
      }
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (0 < (int)uVar14) {
    ppvVar2 = vNodes0_00->pArray;
    uVar17 = 0;
    do {
      piVar3 = (int *)ppvVar2[uVar17];
      if (((piVar3[6] & 7U) == 2) && (p1->nTruePis <= *piVar3)) {
        pAVar9 = Aig_ObjCreateCi(pNew);
        *(Aig_Obj_t **)(piVar3 + 10) = pAVar9;
      }
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  if (0 < iVar18) {
    ppvVar2 = vNodes0->pArray;
    lVar12 = 0;
    do {
      pvVar4 = ppvVar2[lVar12];
      if (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7) {
        if (((ulong)pvVar4 & 1) != 0) goto LAB_006f4612;
        uVar17 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar17 + 0x28));
        }
        uVar17 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar13 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar13 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^ *(ulong *)(uVar17 + 0x28))
          ;
        }
        pAVar9 = Aig_And(pNew,pAVar9,pAVar13);
        *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar9;
      }
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (0 < (int)uVar14) {
    ppvVar2 = vNodes0_00->pArray;
    uVar17 = 0;
    do {
      pvVar4 = ppvVar2[uVar17];
      if (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7) {
        if (((ulong)pvVar4 & 1) != 0) goto LAB_006f4612;
        uVar10 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        uVar10 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar13 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar13 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^ *(ulong *)(uVar10 + 0x28))
          ;
        }
        pAVar9 = Aig_And(pNew,pAVar9,pAVar13);
        *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar9;
      }
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  Saig_ManWindowCreatePos(pNew,p0,p1);
  if (iVar18 < 1) {
    iVar18 = 0;
  }
  else {
    ppvVar2 = vNodes0->pArray;
    lVar12 = 0;
    iVar18 = 0;
    do {
      piVar3 = (int *)ppvVar2[lVar12];
      if ((((uint)*(undefined8 *)(piVar3 + 6) & 7) == 2) && (p0->nTruePis <= *piVar3)) {
        if (*piVar3 < p0->nTruePis) goto LAB_006f45d4;
        uVar5 = (*piVar3 - p0->nTruePis) + p0->nTruePos;
        if (((int)uVar5 < 0) || (p0->vCos->nSize <= (int)uVar5)) goto LAB_006f4596;
        pvVar4 = p0->vCos->pArray[uVar5];
        if (((ulong)pvVar4 & 1) != 0) goto LAB_006f4612;
        uVar17 = *(ulong *)((long)pvVar4 + 8);
        uVar10 = uVar17 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar17 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        Aig_ObjCreateCo(pNew,pAVar9);
        iVar18 = iVar18 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (0 < (int)uVar14) {
    ppvVar2 = vNodes0_00->pArray;
    uVar17 = 0;
    do {
      piVar3 = (int *)ppvVar2[uVar17];
      if ((((uint)*(undefined8 *)(piVar3 + 6) & 7) == 2) && (p1->nTruePis <= *piVar3)) {
        if (*piVar3 < p1->nTruePis) {
LAB_006f45d4:
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar14 = (*piVar3 - p1->nTruePis) + p1->nTruePos;
        if (((int)uVar14 < 0) || (p1->vCos->nSize <= (int)uVar14)) {
LAB_006f4596:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = p1->vCos->pArray[uVar14];
        if (((ulong)pvVar4 & 1) != 0) {
LAB_006f4612:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar10 = *(ulong *)((long)pvVar4 + 8);
        uVar11 = uVar10 & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar10 & 1) ^ *(ulong *)(uVar11 + 0x28));
        }
        Aig_ObjCreateCo(pNew,pAVar9);
        iVar18 = iVar18 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  Aig_ManSetRegNum(pNew,iVar18);
  Aig_ManCleanup(pNew);
  if (vNodes0->pArray != (void **)0x0) {
    free(vNodes0->pArray);
    vNodes0->pArray = (void **)0x0;
  }
  if (vNodes0 != (Vec_Ptr_t *)0x0) {
    free(vNodes0);
  }
  if (vNodes0_00->pArray != (void **)0x0) {
    free(vNodes0_00->pArray);
    vNodes0_00->pArray = (void **)0x0;
  }
  if (vNodes0_00 != (Vec_Ptr_t *)0x0) {
    free(vNodes0_00);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj0, * pObj1, * pMatch0, * pMatch1;
    Vec_Ptr_t * vNodes0, * vNodes1;
    int i, nRegCount;
    // add matching of POs and LIs
    Saig_ManForEachPo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    Saig_ManForEachLi( p0, pObj0, i )
    {
        pMatch0 = Saig_ObjLiToLo( p0, pObj0 );
        pMatch1 = Aig_ObjRepr( p0, pMatch0 );
        if ( pMatch1 == NULL )
            continue;
        assert( pMatch0 == Aig_ObjRepr( p1, pMatch1 ) );
        pObj1 = Saig_ObjLoToLi( p1, pMatch1 );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    // clean the markings
    Aig_ManCleanData( p0 ); 
    Aig_ManCleanData( p1 ); 
    // collect nodes that are not linked
    vNodes0 = Saig_ManCollectedDiffNodes( p0, p1 );
    vNodes1 = Saig_ManCollectedDiffNodes( p1, p0 );
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes0) + Vec_PtrSize(vNodes1) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj0 = Aig_ManConst1( p0 );
    pObj0->pData = Aig_ManConst1( pNew );
    pObj1 = Aig_ManConst1( p1 );
    pObj1->pData = Aig_ManConst1( pNew );
    // create real PIs
    Saig_ManWindowCreatePis( pNew, p0, p1, vNodes0 );
    Saig_ManWindowCreatePis( pNew, p1, p0, vNodes1 );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
            pObj0->pData = Aig_ObjCreateCi(pNew);
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
            pObj1->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Aig_ObjIsNode(pObj0) )
            pObj0->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Aig_ObjIsNode(pObj1) )
            pObj1->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj1), Aig_ObjChild1Copy(pObj1) );
    }
    // create POs
    Saig_ManWindowCreatePos( pNew, p0, p1 );
//    Saig_ManWindowCreatePos( pNew, p1, p0 );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
        {
            pMatch0 = Saig_ObjLoToLi( p0, pObj0 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch0) );
            nRegCount++;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
        {
            pMatch1 = Saig_ObjLoToLi( p1, pObj1 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch1) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    return pNew;
}